

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuVfsShmUnmap(sqlite3_file *pFile,int delFlag)

{
  int iVar1;
  
  if ((pFile[3].pMethods != (sqlite3_io_methods *)0x0) && ((pFile[3].pMethods)->iVersion - 1U < 2))
  {
    return 0;
  }
  rbuUnlockShm((rbu_file *)pFile);
  iVar1 = (**(code **)(*(long *)pFile[1].pMethods + 0x80))(pFile[1].pMethods,delFlag);
  return iVar1;
}

Assistant:

static int rbuVfsShmUnmap(sqlite3_file *pFile, int delFlag){
  rbu_file *p = (rbu_file*)pFile;
  int rc = SQLITE_OK;
  int eStage = (p->pRbu ? p->pRbu->eStage : 0);

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( eStage==RBU_STAGE_OAL || eStage==RBU_STAGE_MOVE ){
    /* no-op */
  }else{
    /* Release the checkpointer and writer locks */
    rbuUnlockShm(p);
    rc = p->pReal->pMethods->xShmUnmap(p->pReal, delFlag);
  }
  return rc;
}